

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWRepository.cxx
# Opt level: O0

void __thiscall cmCPackeIFWUpdatesPatcher::EndElement(cmCPackeIFWUpdatesPatcher *this,string *name)

{
  bool bVar1;
  string *name_local;
  cmCPackeIFWUpdatesPatcher *this_local;
  
  bVar1 = std::operator==(name,"Updates");
  if ((bVar1) && ((this->patched & 1U) == 0)) {
    cmCPackIFWRepository::WriteRepositoryUpdates(this->repository,this->xout);
    this->patched = true;
  }
  cmXMLWriter::EndElement(this->xout);
  if (((this->patched & 1U) == 0) && (bVar1 = std::operator==(name,"Checksum"), bVar1)) {
    cmCPackIFWRepository::WriteRepositoryUpdates(this->repository,this->xout);
    this->patched = true;
  }
  return;
}

Assistant:

void EndElement(const std::string& name) CM_OVERRIDE
  {
    if (name == "Updates" && !this->patched) {
      this->repository->WriteRepositoryUpdates(this->xout);
      this->patched = true;
    }
    this->xout.EndElement();
    if (this->patched) {
      return;
    }
    if (name == "Checksum") {
      this->repository->WriteRepositoryUpdates(this->xout);
      this->patched = true;
    }
  }